

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# age.cpp
# Opt level: O2

void duckdb::AgeFunction(DataChunk *input,ExpressionState *state,Vector *result)

{
  VectorType VVar1;
  VectorType VVar2;
  unsigned_long *puVar3;
  interval_t *piVar4;
  idx_t count;
  data_ptr_t pdVar5;
  data_ptr_t pdVar6;
  data_ptr_t pdVar7;
  ulong uVar8;
  reference vector;
  reference vector_00;
  idx_t iVar9;
  idx_t iVar10;
  ulong uVar11;
  int64_t *piVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  ValidityMask *pVVar17;
  idx_t iVar18;
  interval_t iVar19;
  int64_t *local_100;
  UnifiedVectorFormat local_c0;
  UnifiedVectorFormat ldata;
  
  vector = vector<duckdb::Vector,_true>::get<true>(&input->data,0);
  vector_00 = vector<duckdb::Vector,_true>::get<true>(&input->data,1);
  VVar1 = vector->vector_type;
  VVar2 = vector_00->vector_type;
  if ((VVar1 ^ CONSTANT_VECTOR) == FLAT_VECTOR && (VVar2 ^ CONSTANT_VECTOR) == FLAT_VECTOR) {
    Vector::SetVectorType(result,CONSTANT_VECTOR);
    puVar3 = (vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
    piVar4 = (interval_t *)result->data;
    if (((puVar3 == (unsigned_long *)0x0) || ((*puVar3 & 1) != 0)) &&
       ((puVar3 = (vector_00->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask,
        puVar3 == (unsigned_long *)0x0 || ((*puVar3 & 1) != 0)))) {
      iVar19 = BinaryLambdaWrapperWithNulls::
               Operation<duckdb::AgeFunction(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,bool,duckdb::timestamp_t,duckdb::timestamp_t,duckdb::interval_t>
                         (*(undefined8 *)vector->data,*(undefined8 *)vector_00->data,
                          &result->validity,0);
      *piVar4 = iVar19;
      return;
    }
  }
  else {
    count = input->count;
    if ((VVar2 ^ CONSTANT_VECTOR) == FLAT_VECTOR && VVar1 == FLAT_VECTOR) {
      pdVar5 = vector->data;
      pdVar6 = vector_00->data;
      puVar3 = (vector_00->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      if ((puVar3 == (unsigned_long *)0x0) || ((*puVar3 & 1) != 0)) {
        Vector::SetVectorType(result,FLAT_VECTOR);
        pdVar7 = result->data;
        FlatVector::VerifyFlatVector(result);
        pVVar17 = &result->validity;
        FlatVector::VerifyFlatVector(vector);
        TemplatedValidityMask<unsigned_long>::Copy
                  (&pVVar17->super_TemplatedValidityMask<unsigned_long>,
                   &(vector->validity).super_TemplatedValidityMask<unsigned_long>,count);
        if ((result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
            (unsigned_long *)0x0) {
          piVar12 = (int64_t *)(pdVar7 + 8);
          for (iVar18 = 0; count != iVar18; iVar18 = iVar18 + 1) {
            iVar19 = BinaryLambdaWrapperWithNulls::
                     Operation<duckdb::AgeFunction(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,bool,duckdb::timestamp_t,duckdb::timestamp_t,duckdb::interval_t>
                               (*(undefined8 *)(pdVar5 + iVar18 * 8),*(undefined8 *)pdVar6,pVVar17,
                                iVar18);
            piVar12[-1] = iVar19._0_8_;
            *piVar12 = iVar19.micros;
            piVar12 = piVar12 + 2;
          }
          return;
        }
        uVar14 = 0;
        uVar16 = 0;
        do {
          if (uVar14 == count + 0x3f >> 6) {
            return;
          }
          puVar3 = (pVVar17->super_TemplatedValidityMask<unsigned_long>).validity_mask;
          if (puVar3 == (unsigned_long *)0x0) {
            uVar15 = uVar16 + 0x40;
            if (count <= uVar16 + 0x40) {
              uVar15 = count;
            }
LAB_01c6b0ec:
            piVar12 = (int64_t *)(pdVar7 + uVar16 * 0x10 + 8);
            for (; uVar11 = uVar16, uVar16 < uVar15; uVar16 = uVar16 + 1) {
              iVar19 = BinaryLambdaWrapperWithNulls::
                       Operation<duckdb::AgeFunction(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,bool,duckdb::timestamp_t,duckdb::timestamp_t,duckdb::interval_t>
                                 (*(undefined8 *)(pdVar5 + uVar16 * 8),*(undefined8 *)pdVar6,pVVar17
                                  ,uVar16);
              piVar12[-1] = iVar19._0_8_;
              *piVar12 = iVar19.micros;
              piVar12 = piVar12 + 2;
            }
          }
          else {
            uVar8 = puVar3[uVar14];
            uVar15 = uVar16 + 0x40;
            if (count <= uVar16 + 0x40) {
              uVar15 = count;
            }
            if (uVar8 == 0xffffffffffffffff) goto LAB_01c6b0ec;
            uVar11 = uVar15;
            if (uVar8 != 0) {
              piVar12 = (int64_t *)(pdVar7 + uVar16 * 0x10 + 8);
              for (uVar13 = 0; uVar11 = uVar16 + uVar13, uVar16 + uVar13 < uVar15;
                  uVar13 = uVar13 + 1) {
                if ((uVar8 >> (uVar13 & 0x3f) & 1) != 0) {
                  iVar19 = BinaryLambdaWrapperWithNulls::
                           Operation<duckdb::AgeFunction(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,bool,duckdb::timestamp_t,duckdb::timestamp_t,duckdb::interval_t>
                                     (*(undefined8 *)(pdVar5 + uVar13 * 8 + uVar16 * 8),
                                      *(undefined8 *)pdVar6,pVVar17);
                  piVar12[-1] = iVar19._0_8_;
                  *piVar12 = iVar19.micros;
                }
                piVar12 = piVar12 + 2;
              }
            }
          }
          uVar14 = uVar14 + 1;
          uVar16 = uVar11;
        } while( true );
      }
    }
    else {
      if ((VVar1 ^ CONSTANT_VECTOR) != FLAT_VECTOR || VVar2 != FLAT_VECTOR) {
        if (VVar2 == FLAT_VECTOR && VVar1 == FLAT_VECTOR) {
          pdVar5 = vector->data;
          pdVar6 = vector_00->data;
          Vector::SetVectorType(result,FLAT_VECTOR);
          pdVar7 = result->data;
          FlatVector::VerifyFlatVector(result);
          pVVar17 = &result->validity;
          FlatVector::VerifyFlatVector(vector);
          TemplatedValidityMask<unsigned_long>::Copy
                    (&pVVar17->super_TemplatedValidityMask<unsigned_long>,
                     &(vector->validity).super_TemplatedValidityMask<unsigned_long>,count);
          puVar3 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          FlatVector::VerifyFlatVector(vector_00);
          if (puVar3 == (unsigned_long *)0x0) {
            TemplatedValidityMask<unsigned_long>::Copy
                      (&pVVar17->super_TemplatedValidityMask<unsigned_long>,
                       &(vector_00->validity).super_TemplatedValidityMask<unsigned_long>,count);
          }
          else {
            ValidityMask::Combine(pVVar17,&vector_00->validity,count);
          }
          if ((pVVar17->super_TemplatedValidityMask<unsigned_long>).validity_mask ==
              (unsigned_long *)0x0) {
            local_100 = (int64_t *)(pdVar7 + 8);
            for (iVar18 = 0; count != iVar18; iVar18 = iVar18 + 1) {
              iVar19 = BinaryLambdaWrapperWithNulls::
                       Operation<duckdb::AgeFunction(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,bool,duckdb::timestamp_t,duckdb::timestamp_t,duckdb::interval_t>
                                 (*(undefined8 *)(pdVar5 + iVar18 * 8),
                                  *(undefined8 *)(pdVar6 + iVar18 * 8),pVVar17,iVar18);
              local_100[-1] = iVar19._0_8_;
              *local_100 = iVar19.micros;
              local_100 = local_100 + 2;
            }
          }
          else {
            uVar16 = 0;
            for (uVar14 = 0; uVar14 != count + 0x3f >> 6; uVar14 = uVar14 + 1) {
              puVar3 = (pVVar17->super_TemplatedValidityMask<unsigned_long>).validity_mask;
              if (puVar3 == (unsigned_long *)0x0) {
                uVar15 = uVar16 + 0x40;
                if (count <= uVar16 + 0x40) {
                  uVar15 = count;
                }
LAB_01c6b69e:
                piVar12 = (int64_t *)(pdVar7 + uVar16 * 0x10 + 8);
                for (; uVar11 = uVar16, uVar16 < uVar15; uVar16 = uVar16 + 1) {
                  iVar19 = BinaryLambdaWrapperWithNulls::
                           Operation<duckdb::AgeFunction(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,bool,duckdb::timestamp_t,duckdb::timestamp_t,duckdb::interval_t>
                                     (*(undefined8 *)(pdVar5 + uVar16 * 8),
                                      *(undefined8 *)(pdVar6 + uVar16 * 8),pVVar17,uVar16);
                  piVar12[-1] = iVar19._0_8_;
                  *piVar12 = iVar19.micros;
                  piVar12 = piVar12 + 2;
                }
              }
              else {
                uVar8 = puVar3[uVar14];
                uVar15 = uVar16 + 0x40;
                if (count <= uVar16 + 0x40) {
                  uVar15 = count;
                }
                if (uVar8 == 0xffffffffffffffff) goto LAB_01c6b69e;
                uVar11 = uVar15;
                if (uVar8 != 0) {
                  piVar12 = (int64_t *)(pdVar7 + uVar16 * 0x10 + 8);
                  for (uVar13 = 0; uVar11 = uVar16 + uVar13, uVar16 + uVar13 < uVar15;
                      uVar13 = uVar13 + 1) {
                    if ((uVar8 >> (uVar13 & 0x3f) & 1) != 0) {
                      iVar19 = BinaryLambdaWrapperWithNulls::
                               Operation<duckdb::AgeFunction(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,bool,duckdb::timestamp_t,duckdb::timestamp_t,duckdb::interval_t>
                                         (*(undefined8 *)(pdVar5 + uVar13 * 8 + uVar16 * 8),
                                          *(undefined8 *)(pdVar6 + uVar13 * 8 + uVar16 * 8),pVVar17)
                      ;
                      piVar12[-1] = iVar19._0_8_;
                      *piVar12 = iVar19.micros;
                    }
                    piVar12 = piVar12 + 2;
                  }
                }
              }
              uVar16 = uVar11;
            }
          }
        }
        else {
          UnifiedVectorFormat::UnifiedVectorFormat(&ldata);
          UnifiedVectorFormat::UnifiedVectorFormat(&local_c0);
          Vector::ToUnifiedFormat(vector,count,&ldata);
          Vector::ToUnifiedFormat(vector_00,count,&local_c0);
          Vector::SetVectorType(result,FLAT_VECTOR);
          pdVar5 = result->data;
          FlatVector::VerifyFlatVector(result);
          pVVar17 = &result->validity;
          if (local_c0.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
              (unsigned_long *)0x0 &&
              ldata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
              (unsigned_long *)0x0) {
            piVar12 = (int64_t *)(pdVar5 + 8);
            for (iVar18 = 0; count != iVar18; iVar18 = iVar18 + 1) {
              iVar9 = iVar18;
              if ((ldata.sel)->sel_vector != (sel_t *)0x0) {
                iVar9 = (idx_t)(ldata.sel)->sel_vector[iVar18];
              }
              iVar10 = iVar18;
              if ((local_c0.sel)->sel_vector != (sel_t *)0x0) {
                iVar10 = (idx_t)(local_c0.sel)->sel_vector[iVar18];
              }
              iVar19 = BinaryLambdaWrapperWithNulls::
                       Operation<duckdb::AgeFunction(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,bool,duckdb::timestamp_t,duckdb::timestamp_t,duckdb::interval_t>
                                 (*(undefined8 *)(ldata.data + iVar9 * 8),
                                  *(undefined8 *)(local_c0.data + iVar10 * 8),pVVar17,iVar18);
              piVar12[-1] = iVar19._0_8_;
              *piVar12 = iVar19.micros;
              piVar12 = piVar12 + 2;
            }
          }
          else {
            piVar12 = (int64_t *)(pdVar5 + 8);
            for (iVar18 = 0; count != iVar18; iVar18 = iVar18 + 1) {
              iVar9 = iVar18;
              if ((ldata.sel)->sel_vector != (sel_t *)0x0) {
                iVar9 = (idx_t)(ldata.sel)->sel_vector[iVar18];
              }
              iVar10 = iVar18;
              if ((local_c0.sel)->sel_vector != (sel_t *)0x0) {
                iVar10 = (idx_t)(local_c0.sel)->sel_vector[iVar18];
              }
              if (((ldata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
                    (unsigned_long *)0x0) ||
                  ((ldata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                    [iVar9 >> 6] >> (iVar9 & 0x3f) & 1) != 0)) &&
                 ((local_c0.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
                   (unsigned_long *)0x0 ||
                  ((local_c0.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                    [iVar10 >> 6] >> (iVar10 & 0x3f) & 1) != 0)))) {
                iVar19 = BinaryLambdaWrapperWithNulls::
                         Operation<duckdb::AgeFunction(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,bool,duckdb::timestamp_t,duckdb::timestamp_t,duckdb::interval_t>
                                   (*(undefined8 *)(ldata.data + iVar9 * 8),
                                    *(undefined8 *)(local_c0.data + iVar10 * 8),pVVar17,iVar18);
                piVar12[-1] = iVar19._0_8_;
                *piVar12 = iVar19.micros;
              }
              else {
                TemplatedValidityMask<unsigned_long>::SetInvalid
                          (&pVVar17->super_TemplatedValidityMask<unsigned_long>,iVar18);
              }
              piVar12 = piVar12 + 2;
            }
          }
          UnifiedVectorFormat::~UnifiedVectorFormat(&local_c0);
          UnifiedVectorFormat::~UnifiedVectorFormat(&ldata);
        }
        return;
      }
      pdVar5 = vector->data;
      puVar3 = (vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      pdVar6 = vector_00->data;
      if ((puVar3 == (unsigned_long *)0x0) || ((*puVar3 & 1) != 0)) {
        Vector::SetVectorType(result,FLAT_VECTOR);
        pdVar7 = result->data;
        FlatVector::VerifyFlatVector(result);
        pVVar17 = &result->validity;
        FlatVector::VerifyFlatVector(vector_00);
        TemplatedValidityMask<unsigned_long>::Copy
                  (&pVVar17->super_TemplatedValidityMask<unsigned_long>,
                   &(vector_00->validity).super_TemplatedValidityMask<unsigned_long>,count);
        if ((result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
            (unsigned_long *)0x0) {
          piVar12 = (int64_t *)(pdVar7 + 8);
          for (iVar18 = 0; count != iVar18; iVar18 = iVar18 + 1) {
            iVar19 = BinaryLambdaWrapperWithNulls::
                     Operation<duckdb::AgeFunction(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,bool,duckdb::timestamp_t,duckdb::timestamp_t,duckdb::interval_t>
                               (*(undefined8 *)pdVar5,*(undefined8 *)(pdVar6 + iVar18 * 8),pVVar17,
                                iVar18);
            piVar12[-1] = iVar19._0_8_;
            *piVar12 = iVar19.micros;
            piVar12 = piVar12 + 2;
          }
          return;
        }
        uVar14 = 0;
        uVar16 = 0;
        do {
          if (uVar14 == count + 0x3f >> 6) {
            return;
          }
          puVar3 = (pVVar17->super_TemplatedValidityMask<unsigned_long>).validity_mask;
          if (puVar3 == (unsigned_long *)0x0) {
            uVar15 = uVar16 + 0x40;
            if (count <= uVar16 + 0x40) {
              uVar15 = count;
            }
LAB_01c6b399:
            piVar12 = (int64_t *)(pdVar7 + uVar16 * 0x10 + 8);
            for (; uVar11 = uVar16, uVar16 < uVar15; uVar16 = uVar16 + 1) {
              iVar19 = BinaryLambdaWrapperWithNulls::
                       Operation<duckdb::AgeFunction(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,bool,duckdb::timestamp_t,duckdb::timestamp_t,duckdb::interval_t>
                                 (*(undefined8 *)pdVar5,*(undefined8 *)(pdVar6 + uVar16 * 8),pVVar17
                                  ,uVar16);
              piVar12[-1] = iVar19._0_8_;
              *piVar12 = iVar19.micros;
              piVar12 = piVar12 + 2;
            }
          }
          else {
            uVar8 = puVar3[uVar14];
            uVar15 = uVar16 + 0x40;
            if (count <= uVar16 + 0x40) {
              uVar15 = count;
            }
            if (uVar8 == 0xffffffffffffffff) goto LAB_01c6b399;
            uVar11 = uVar15;
            if (uVar8 != 0) {
              piVar12 = (int64_t *)(pdVar7 + uVar16 * 0x10 + 8);
              for (uVar13 = 0; uVar11 = uVar16 + uVar13, uVar16 + uVar13 < uVar15;
                  uVar13 = uVar13 + 1) {
                if ((uVar8 >> (uVar13 & 0x3f) & 1) != 0) {
                  iVar19 = BinaryLambdaWrapperWithNulls::
                           Operation<duckdb::AgeFunction(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,bool,duckdb::timestamp_t,duckdb::timestamp_t,duckdb::interval_t>
                                     (*(undefined8 *)pdVar5,
                                      *(undefined8 *)(pdVar6 + uVar13 * 8 + uVar16 * 8),pVVar17);
                  piVar12[-1] = iVar19._0_8_;
                  *piVar12 = iVar19.micros;
                }
                piVar12 = piVar12 + 2;
              }
            }
          }
          uVar14 = uVar14 + 1;
          uVar16 = uVar11;
        } while( true );
      }
    }
    Vector::SetVectorType(result,CONSTANT_VECTOR);
  }
  ConstantVector::SetNull(result,true);
  return;
}

Assistant:

static void AgeFunction(DataChunk &input, ExpressionState &state, Vector &result) {
	D_ASSERT(input.ColumnCount() == 2);

	BinaryExecutor::ExecuteWithNulls<timestamp_t, timestamp_t, interval_t>(
	    input.data[0], input.data[1], result, input.size(),
	    [&](timestamp_t input1, timestamp_t input2, ValidityMask &mask, idx_t idx) {
		    if (Timestamp::IsFinite(input1) && Timestamp::IsFinite(input2)) {
			    return Interval::GetAge(input1, input2);
		    } else {
			    mask.SetInvalid(idx);
			    return interval_t();
		    }
	    });
}